

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_fixed_point.cpp
# Opt level: O1

Convergence_Data * __thiscall
Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>::solve_system
          (Convergence_Data *__return_storage_ptr__,
          Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *this,
          Matrix_Sparse *a_matrix,Vector_Dense<double,_0UL> *x_vector,
          Vector_Dense<double,_0UL> *b_vector)

{
  double dVar1;
  rep rVar2;
  
  __return_storage_ptr__->residual_max_0 = 0.0;
  __return_storage_ptr__->residual_max_normalised = 0.0;
  __return_storage_ptr__->residual_normalised = 0.0;
  __return_storage_ptr__->residual_max = 0.0;
  __return_storage_ptr__->residual = 0.0;
  __return_storage_ptr__->residual_0 = 0.0;
  (__return_storage_ptr__->start_time).__d.__r = 0;
  __return_storage_ptr__->iteration = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->duration).__r = 0;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (__return_storage_ptr__->start_time).__d.__r = rVar2;
  __return_storage_ptr__->iteration = 0;
  __return_storage_ptr__->residual = 1.79769313486232e+308;
  __return_storage_ptr__->residual_0 = 1.79769313486232e+308;
  __return_storage_ptr__->residual_normalised = 1.79769313486232e+308;
  __return_storage_ptr__->residual_max = 1.79769313486232e+308;
  __return_storage_ptr__->residual_max_0 = 1.79769313486232e+308;
  __return_storage_ptr__->residual_max_normalised = 1.79769313486232e+308;
  while ((__return_storage_ptr__->iteration <
          (this->
          super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
          ).data.super_Solver_Data.limits.min_iterations ||
         ((__return_storage_ptr__->iteration <=
           (this->
           super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
           ).data.super_Solver_Data.limits.max_iteration &&
          ((dVar1 = (this->
                    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
                    ).data.super_Solver_Data.limits.tolerance,
           dVar1 < __return_storage_ptr__->residual_normalised ||
           (dVar1 * 10.0 < __return_storage_ptr__->residual_max_normalised))))))) {
    forward_sweep(a_matrix,x_vector,x_vector,b_vector,1.5);
    Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
              (__return_storage_ptr__,a_matrix,x_vector,b_vector);
  }
  return __return_storage_ptr__;
}

Assistant:

Convergence_Data Solver_Fixed_Point<Solver_Type::successive_over_relaxation, Solver_Fixed_Point_Sor_Data>::solve_system(
const Matrix_Sparse& a_matrix, Vector_Dense<Scalar, 0>& x_vector, const Vector_Dense<Scalar, 0>& b_vector) {
  Convergence_Data convergence_data = Convergence_Data();
  while(!data.limits.is_converged(convergence_data)) {
    forward_sweep(a_matrix, x_vector, x_vector, b_vector, 1.5);
    convergence_data.update(a_matrix, x_vector, b_vector);
  }

  return convergence_data;
}